

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TablePushBackgroundChannel(void)

{
  ImGuiWindow *window;
  ImGuiTable *pIVar1;
  ImVec2 IVar2;
  
  window = GImGui->CurrentWindow;
  pIVar1 = GImGui->CurrentTable;
  IVar2 = (window->ClipRect).Max;
  (pIVar1->HostBackupInnerClipRect).Min = (window->ClipRect).Min;
  (pIVar1->HostBackupInnerClipRect).Max = IVar2;
  SetWindowClipRectBeforeSetChannel(window,&pIVar1->Bg2ClipRectForDrawCmd);
  ImDrawListSplitter::SetCurrentChannel
            (pIVar1->DrawSplitter,window->DrawList,(uint)pIVar1->Bg2DrawChannelCurrent);
  return;
}

Assistant:

void ImGui::TablePushBackgroundChannel()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiTable* table = g.CurrentTable;

    // Optimization: avoid SetCurrentChannel() + PushClipRect()
    table->HostBackupInnerClipRect = window->ClipRect;
    SetWindowClipRectBeforeSetChannel(window, table->Bg2ClipRectForDrawCmd);
    table->DrawSplitter->SetCurrentChannel(window->DrawList, table->Bg2DrawChannelCurrent);
}